

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

cf_size_t cf_str_count_for(cf_char_t *s,cf_char_t c)

{
  cf_size_t cVar1;
  char cVar2;
  char *pcVar3;
  
  if (s != (cf_char_t *)0x0) {
    if (c == '\0') {
      return 1;
    }
    cVar2 = *s;
    if (cVar2 != '\0') {
      pcVar3 = s + 1;
      cVar1 = 0;
      do {
        cVar1 = cVar1 + (cVar2 == c);
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
      return cVar1;
    }
  }
  return 0;
}

Assistant:

cf_size_t cf_str_count_for(cf_char_t* s, cf_char_t c) {
    cf_size_t cnt = 0;

    if (!s) return 0;
    if (c == '\0') return 1;

    while (*s != '\0') {
        if (*s == c) cnt ++;
        s++;
    }
    return cnt;
}